

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::ShellCommand::processMakefileDiscoveredDependencies(llbuild::buildsystem::
BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::StringRef,llvm::
MemoryBuffer*,bool)::DepsActions::error(llvm::StringRef_unsigned_long_
          (void *this,StringRef message,uint64_t position)

{
  undefined8 uVar1;
  raw_ostream *prVar2;
  BuildSystemDelegate *pBVar3;
  string *psVar4;
  string msg;
  raw_string_ostream msgStream;
  string local_80;
  raw_string_ostream local_60;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_60.super_raw_ostream.BufferMode = InternalBuffer;
  local_60.super_raw_ostream.OutBufStart = (char *)0x0;
  local_60.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_60.super_raw_ostream.OutBufCur = (char *)0x0;
  local_60.super_raw_ostream._vptr_raw_ostream = (_func_int **)&PTR__raw_string_ostream_001dc268;
  local_60.OS = &local_80;
  prVar2 = llvm::raw_ostream::operator<<
                     (&local_60.super_raw_ostream,"error reading dependency file \'");
  prVar2 = llvm::raw_ostream::operator<<(prVar2,*(StringRef *)((long)this + 0x28));
  prVar2 = llvm::raw_ostream::operator<<(prVar2,"\': ");
  prVar2 = llvm::raw_ostream::operator<<(prVar2,message);
  prVar2 = llvm::raw_ostream::operator<<(prVar2," at position ");
  llvm::raw_ostream::operator<<(prVar2,position);
  pBVar3 = BuildSystem::getDelegate(*(BuildSystem **)((long)this + 8));
  uVar1 = *(undefined8 *)((long)this + 0x20);
  psVar4 = llvm::raw_string_ostream::str_abi_cxx11_(&local_60);
  (*pBVar3->_vptr_BuildSystemDelegate[0xb])
            (pBVar3,uVar1,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
  *(int *)((long)this + 0x38) = *(int *)((long)this + 0x38) + 1;
  llvm::raw_string_ostream::~raw_string_ostream(&local_60);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual void error(StringRef message, uint64_t position) override {
      std::string msg;
      raw_string_ostream msgStream(msg);
      msgStream << "error reading dependency file '" << depsPath << "': "
          << message << " at position " << position;
      system.getDelegate().commandHadError(command, msgStream.str());
      ++numErrors;
    }